

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hidpi.c
# Opt level: O0

void pretty_square(uint *p,int dimen)

{
  uint uVar1;
  uint uVar2;
  int in_ESI;
  void *in_RDI;
  int y;
  int x;
  int three_quarter_dimen;
  int one_quarter_dimen;
  int one_half_dimen;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  memset(in_RDI,0x7f,(long)(in_ESI * in_ESI * 4));
  uVar1 = in_ESI / 2;
  uVar2 = (int)uVar1 / 2;
  for (local_1c = uVar2; local_20 = uVar2, (int)local_1c < (int)(uVar1 + uVar2);
      local_1c = local_1c + 1) {
    for (; (int)local_20 < (int)(uVar1 + uVar2); local_20 = local_20 + 1) {
      if ((local_1c & 1) == 0) {
        local_24 = 0;
      }
      else {
        local_24 = ((local_1c - uVar2) * 0xff) / uVar1 | 0xdf0000;
      }
      *(uint *)((long)in_RDI + (long)(int)(local_20 * in_ESI + local_1c) * 4) = local_24;
    }
  }
  return;
}

Assistant:

void
pretty_square(unsigned int *p, int dimen)
{
  memset(p, 127, dimen*dimen*4);
  const int one_half_dimen = dimen / 2;
  const int one_quarter_dimen = one_half_dimen / 2;
  const int three_quarter_dimen = one_half_dimen + one_quarter_dimen;
  for (int x = one_quarter_dimen; x < three_quarter_dimen; x++)
    for (int y = one_quarter_dimen; y < three_quarter_dimen; y++)
      p[y*dimen + x] = (x & 1) ? MFB_RGB(223,0,(255*(x-one_quarter_dimen))/one_half_dimen) : MFB_RGB(0,0,0);
}